

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

Configuration * __thiscall
el::base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
get<el::Level,el::ConfigurationType>
          (RegistryWithPred<el::Configuration,el::Configuration::Predicate> *this,Level *arg1,
          ConfigurationType arg2)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  _Var4;
  Configuration *pCVar5;
  
  puVar2 = (undefined8 *)(**(code **)(*(long *)this + 0x58))();
  uVar1 = *puVar2;
  lVar3 = (**(code **)(*(long *)this + 0x58))(this);
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<el::Configuration**,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>,__gnu_cxx::__ops::_Iter_pred<el::Configuration::Predicate>>
                    (uVar1,*(undefined8 *)(lVar3 + 8),CONCAT44(arg2,*arg1));
  lVar3 = (**(code **)(*(long *)this + 0x58))(this);
  if (_Var4._M_current == *(Configuration ***)(lVar3 + 8)) {
    pCVar5 = (Configuration *)0x0;
  }
  else {
    pCVar5 = *_Var4._M_current;
  }
  return pCVar5;
}

Assistant:

T_Ptr* get(const T& arg1, const T2 arg2) {
    iterator iter = std::find_if(this->list().begin(), this->list().end(), Pred(arg1, arg2));
    if (iter != this->list().end() && *iter != nullptr) {
      return *iter;
    }
    return nullptr;
  }